

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O1

void decode_16(FILE *f,uint w,uint h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  size_t __n_00;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  byte *pbVar10;
  bool bVar11;
  uint local_4c;
  
  if (pcx.encoding == '\0') {
    error("Unsupported PCX encoding scheme!");
  }
  else {
    if (pcx.encoding != '\x01') {
      error("Unsupported PCX encoding scheme!");
      return;
    }
    uVar7 = 0;
    local_4c = 0;
    uVar6 = 0;
    pbVar10 = pcx_buf;
    do {
      uVar1 = fgetc((FILE *)f);
      if (uVar1 == 0xffffffff) break;
      if ((~uVar1 & 0xc0) == 0) {
        uVar2 = uVar1 & 0x3f;
        uVar1 = fgetc((FILE *)f);
      }
      else {
        uVar2 = 1;
      }
      do {
        pcx_plane[uVar7 >> 3][uVar6] = (uchar)uVar1;
        uVar7 = uVar7 + 8;
        if (w <= uVar7) {
          uVar6 = uVar6 + 1;
          if (uVar6 == pcx.np) {
            local_4c = local_4c + 1;
            if (w + 7 < 8) {
              uVar7 = 0;
              uVar6 = 0;
            }
            else {
              uVar3 = 0;
              uVar6 = 0;
              do {
                uVar5 = 7;
                uVar7 = uVar6;
                do {
                  bVar9 = 0;
                  bVar8 = 0;
                  bVar4 = (byte)uVar5;
                  switch(pcx.np) {
                  case '\x04':
                    bVar8 = (pcx_plane[uVar3][3] >> (bVar4 & 0x1f) & 1) << 3;
                  case '\x03':
                    bVar8 = bVar8 + (pcx_plane[uVar3][2] >> (bVar4 & 0x1f) & 1) * '\x04';
                  case '\x02':
                    bVar9 = (pcx_plane[uVar3][1] >> (bVar4 & 0x1f)) * '\x02' & 2 | bVar8;
                  case '\x01':
                    bVar9 = (pcx_plane[uVar3][0] >> (uVar5 & 0x1f) & 1) != 0 | bVar9;
                    break;
                  default:
                    bVar9 = 0;
                  }
                  if (uVar7 < w) {
                    *pbVar10 = bVar9;
                    pbVar10 = pbVar10 + 1;
                  }
                  uVar7 = uVar7 + 1;
                  bVar11 = uVar5 != 0;
                  uVar5 = uVar5 - 1;
                } while (bVar11);
                uVar6 = uVar6 + 8;
                uVar3 = uVar3 + 1;
              } while (uVar3 != w + 7 >> 3);
              uVar7 = 0;
              uVar6 = 0;
            }
          }
          else {
            uVar7 = 0;
          }
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    } while (local_4c < h);
  }
  uVar6 = 3 << (pcx.np & 0x1f);
  __n_00 = (size_t)(int)uVar6;
  __n = 0;
  if (uVar6 < 0x300) {
    __n = 0x300 - __n_00;
  }
  memset(pcx_pal[0] + __n_00,0,__n);
  memcpy(pcx_pal,pcx.colormap,__n_00);
  pcx_nb_colors = 0x10;
  return;
}

Assistant:

void
decode_16(FILE *f, unsigned int w, unsigned int h)
{
    int k;
	unsigned int i, j, n;
	unsigned int x, y, p;
	unsigned int c, pix;
	unsigned char *ptr;

	ptr = pcx_buf;
	x = 0;
	y = 0;
	p = 0;

	/* decode */
	switch (pcx.encoding) {
	case 0:
		/* raw */
		error("Unsupported PCX encoding scheme!");
		break;

	case 1:
		/* simple run-length encoding */
		do {
			/* get a char */
			c = fgetc(f);
			if (c == uEOF)
				break;

			/* check if it's a repeat command */
			if ((c & 0xC0) != 0xC0)
				i = 1;
			else {
				i = (c & 0x3F);
				c = fgetc(f);
			}

			/* unpack */
			do {
			    pcx_plane[x >> 3][p] = c;
				x += 8;

				/* end of line */
				if (x >= w) {
					x = 0;
					p++;

					/* plane to chunky conversion */
					if (p == pcx.np) {
						p = 0;
						n = (w + 7) >> 3;
						y++;

						/* loop */
						for (j = 0; j < n; j++) {
							for (k = 7; k >= 0; k--) {
								/* get pixel index */
								pix = 0;

								switch (pcx.np) {
								case 4:
									pix |= ((pcx_plane[j][3] >> k) & 0x01) << 3;
								case 3:
									pix |= ((pcx_plane[j][2] >> k) & 0x01) << 2;
								case 2:
									pix |= ((pcx_plane[j][1] >> k) & 0x01) << 1;
								case 1:
									pix |= ((pcx_plane[j][0] >> k) & 0x01);
									break;
								}

								/* store pixel */
								if (x < w)
									*ptr++ = pix;

								x++;
							}
						}
						x = 0;
					}
				}
			}
			while (--i);
		}
		while (y < h);
		break;

	default:
		error("Unsupported PCX encoding scheme!");
		return;
	}			

	/* get the palette */
	memset(pcx_pal, 0, 768);
	memcpy(pcx_pal, pcx.colormap, (1 << pcx.np) * 3);

	/* number of colors */
	pcx_nb_colors = 16;
}